

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O3

hrgls_Status
hrgls_APICreateParametersSetCredentials
          (hrgls_APICreateParams params,uint8_t *credentials,uint32_t size)

{
  pointer puVar1;
  
  if (params == (hrgls_APICreateParams)0x0) {
    return 0x3ee;
  }
  if (size == 0) {
    puVar1 = (params->credentials).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((params->credentials).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar1) {
      (params->credentials).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar1;
      return 0;
    }
  }
  else {
    if (credentials == (uint8_t *)0x0) {
      return 0x3e9;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&params->credentials,
               credentials,credentials + size);
  }
  return 0;
}

Assistant:

hrgls_Status hrgls_APICreateParametersSetCredentials(hrgls_APICreateParams params,
    const uint8_t *credentials, uint32_t size)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    if (!params) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    if (!size) {
      params->credentials.clear();
    } else {
      if (!credentials) {
        return hrgls_STATUS_BAD_PARAMETER;
      } else {
        // We have a nonzero size and a non-NULL pointer, so copy the data.
        params->credentials.assign(credentials, credentials + size);
      }
    }
    return s;
  }